

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkrequest.cpp
# Opt level: O0

void __thiscall QNetworkRequest::QNetworkRequest(QNetworkRequest *this)

{
  QNetworkRequestPrivate *data;
  QNetworkRequestPrivate *in_RDI;
  undefined1 enable;
  QNetworkRequestPrivate *this_00;
  
  this_00 = in_RDI;
  data = (QNetworkRequestPrivate *)operator_new(0xa8);
  QNetworkRequestPrivate::QNetworkRequestPrivate(in_RDI);
  QSharedDataPointer<QNetworkRequestPrivate>::QSharedDataPointer
            ((QSharedDataPointer<QNetworkRequestPrivate> *)in_RDI,data);
  enable = (undefined1)((ulong)data >> 0x38);
  QSharedDataPointer<QNetworkRequestPrivate>::operator->
            ((QSharedDataPointer<QNetworkRequestPrivate> *)in_RDI);
  QHttp2Configuration::setStreamReceiveWindowSize
            ((QHttp2Configuration *)this_00,(uint)((ulong)in_RDI >> 0x20));
  QSharedDataPointer<QNetworkRequestPrivate>::operator->
            ((QSharedDataPointer<QNetworkRequestPrivate> *)in_RDI);
  QHttp2Configuration::setSessionReceiveWindowSize
            ((QHttp2Configuration *)this_00,(uint)((ulong)in_RDI >> 0x20));
  QSharedDataPointer<QNetworkRequestPrivate>::operator->
            ((QSharedDataPointer<QNetworkRequestPrivate> *)in_RDI);
  QHttp2Configuration::setServerPushEnabled((QHttp2Configuration *)in_RDI,(bool)enable);
  return;
}

Assistant:

QNetworkRequest::QNetworkRequest()
    : d(new QNetworkRequestPrivate)
{
#if QT_CONFIG(http)
    // Initial values proposed by RFC 7540 are quite draconian, but we
    // know about servers configured with this value as maximum possible,
    // rejecting our SETTINGS frame and sending us a GOAWAY frame with the
    // flow control error set. If this causes a problem - the app should
    // set a proper configuration. We'll use our defaults, as documented.
    d->h2Configuration.setStreamReceiveWindowSize(Http2::qtDefaultStreamReceiveWindowSize);
    d->h2Configuration.setSessionReceiveWindowSize(Http2::maxSessionReceiveWindowSize);
    d->h2Configuration.setServerPushEnabled(false);
#endif // QT_CONFIG(http)
}